

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifUtil.c
# Opt level: O3

void If_ManMarkMapping(If_Man_t *p)

{
  void **ppvVar1;
  void *pvVar2;
  long lVar3;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  float fVar6;
  
  lVar3 = (long)p->vObjs->nSize;
  if (0 < lVar3) {
    ppvVar1 = p->vObjs->pArray;
    lVar5 = 0;
    do {
      pvVar2 = ppvVar1[lVar5];
      *(undefined4 *)((long)pvVar2 + 0x34) = 0x60ad78ec;
      *(undefined4 *)((long)pvVar2 + 0x10) = *(undefined4 *)((long)pvVar2 + 0x14);
      *(undefined4 *)((long)pvVar2 + 0xc) = 0;
      lVar5 = lVar5 + 1;
    } while (lVar3 != lVar5);
  }
  p->dPower = 0.0;
  p->AreaGlo = 0.0;
  p->nNets = 0;
  pVVar4 = p->vCos;
  if (0 < pVVar4->nSize) {
    lVar3 = 0;
    do {
      fVar6 = If_ManMarkMapping_rec(p,*(If_Obj_t **)((long)pVVar4->pArray[lVar3] + 0x18));
      p->AreaGlo = fVar6 + p->AreaGlo;
      lVar3 = lVar3 + 1;
      pVVar4 = p->vCos;
    } while (lVar3 < pVVar4->nSize);
  }
  return;
}

Assistant:

void If_ManMarkMapping( If_Man_t * p )
{
    If_Obj_t * pObj;
    int i;
    If_ManForEachObj( p, pObj, i )
    {
        pObj->Required = IF_FLOAT_LARGE;
        pObj->nVisits = pObj->nVisitsCopy;
        pObj->nRefs = 0;
    }
    p->nNets = 0;
    p->dPower = 0.0;
    p->AreaGlo = 0.0;
    If_ManForEachCo( p, pObj, i )
        p->AreaGlo += If_ManMarkMapping_rec( p, If_ObjFanin0(pObj) );
}